

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall fizplex::LPTest_AddAndEditRow_Test::TestBody(LPTest_AddAndEditRow_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  LP lp;
  double in_stack_000002e0;
  double in_stack_000002e8;
  char *in_stack_000002f0;
  char *in_stack_000002f8;
  LP *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  LP *in_stack_ffffffffffffff30;
  undefined1 *lower;
  RowType in_stack_ffffffffffffff44;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  LP *in_stack_ffffffffffffff50;
  RowType in_stack_ffffffffffffff5c;
  LP *in_stack_ffffffffffffff60;
  undefined1 local_90 [144];
  
  lower = local_90;
  LP::LP(in_stack_ffffffffffffff50);
  LP::add_row(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(double)in_stack_ffffffffffffff50,
              (double)in_stack_ffffffffffffff48.ptr_);
  LP::update_row_header
            (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48.ptr_,
             in_stack_ffffffffffffff44,(double)lower,(double)in_stack_ffffffffffffff30);
  LP::row_header(in_stack_ffffffffffffff30,
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff48);
    in_stack_ffffffffffffff20 =
         (LP *)testing::AssertionResult::failure_message((AssertionResult *)0x1c8cd6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x4a,(char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
    testing::Message::~Message((Message *)0x1c8d24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8d64);
  LP::~LP(in_stack_ffffffffffffff20);
  return;
}

Assistant:

TEST(LPTest, AddAndEditRow) {
  LP lp;
  lp.add_row(RowType::Range, -1.0, 2.0);
  lp.update_row_header(0u, RowType::Range, 0.0, 3.0);
  EXPECT_DOUBLE_EQ(0.0, lp.row_header(0u).lower);
}